

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_table_merge_all(PS_Mask_Table table,FT_Memory memory)

{
  FT_UInt FVar1;
  FT_Int FVar2;
  FT_Error local_24;
  FT_UInt local_20;
  FT_Error error;
  FT_Int index2;
  FT_Int index1;
  FT_Memory memory_local;
  PS_Mask_Table table_local;
  
  local_24 = 0;
  FVar1 = table->num_masks;
  do {
    error = FVar1 - 1;
    if (error < 1) {
      return local_24;
    }
    for (local_20 = FVar1 - 2; FVar1 = error, -1 < (int)local_20; local_20 = local_20 - 1) {
      FVar2 = ps_mask_table_test_intersect(table,error,local_20);
      if (FVar2 != 0) {
        local_24 = ps_mask_table_merge(table,local_20,error,memory);
        if (local_24 != 0) {
          return local_24;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

static FT_Error
  ps_mask_table_merge_all( PS_Mask_Table  table,
                           FT_Memory      memory )
  {
    FT_Int    index1, index2;
    FT_Error  error = FT_Err_Ok;


    /* both loops go down to 0, thus FT_Int for index1 and index2 */
    for ( index1 = (FT_Int)table->num_masks - 1; index1 > 0; index1-- )
    {
      for ( index2 = index1 - 1; index2 >= 0; index2-- )
      {
        if ( ps_mask_table_test_intersect( table,
                                           (FT_UInt)index1,
                                           (FT_UInt)index2 ) )
        {
          error = ps_mask_table_merge( table,
                                       (FT_UInt)index2,
                                       (FT_UInt)index1,
                                       memory );
          if ( error )
            goto Exit;

          break;
        }
      }
    }

  Exit:
    return error;
  }